

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  char *pcVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  IRIns *ir;
  TValue TVar5;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  IRIns *pIVar10;
  lua_Number lVar11;
  
  pIVar2 = T->ir;
  uVar8 = (ulong)ref;
  ir = pIVar2 + uVar8;
  if (0x7fff < ref) {
    do {
      uVar7 = (uint)(ir->field_0).prev;
      if (((rfilt >> (uVar8 & 0x3f) & 1) != 0) &&
         (uVar9 = (ulong)(T->nins - 1), *(char *)((long)pIVar2 + uVar9 * 8 + 5) == '\x14')) {
        pIVar10 = pIVar2 + uVar9;
        do {
          if (((uint)uVar8 == (uint)(pIVar10->field_0).op1) && ((pIVar10->field_0).op2 <= snapno)) {
            uVar7 = (uint)(pIVar10->field_0).prev;
          }
          pcVar1 = (char *)((long)pIVar10 + -3);
          pIVar10 = pIVar10 + -1;
        } while (*pcVar1 == '\x14');
      }
      if (0xff < uVar7) {
        uVar7 = uVar7 >> 8;
        uVar4 = (ir->field_1).t.irt & 0x1f;
        if (uVar4 - 0xf < 5) {
          lVar11 = (lua_Number)ex->spill[uVar7];
          goto LAB_00140e0e;
        }
        if (((char)uVar4 == '\x03') || (uVar4 == 0xe)) {
          TVar5 = *(TValue *)(ex->spill + uVar7);
LAB_00140e29:
          *o = TVar5;
          return;
        }
        aVar6 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->spill + uVar7);
LAB_00140e3c:
        (o->field_2).field_0 = aVar6;
LAB_00140e3e:
        (o->field_2).it = ~uVar4;
        return;
      }
      if (uVar7 < 0x80) {
        uVar4 = (ir->field_1).t.irt & 0x1f;
        if (uVar4 - 0xf < 5) {
          lVar11 = (lua_Number)(int)ex->gpr[uVar7];
LAB_00140e0e:
          o->n = lVar11;
          return;
        }
        if ((byte)uVar4 == 3) {
          TVar5 = *(TValue *)(ex->gpr + uVar7);
          goto LAB_00140e29;
        }
        if (uVar4 == 0xe) {
          lVar11 = ex->fpr[uVar7 - 0x10];
          goto LAB_00140e0e;
        }
        if ((byte)uVar4 < 3) goto LAB_00140e3e;
        aVar6 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
                 (ex->gpr + uVar7);
        goto LAB_00140e3c;
      }
      pIVar3 = &(ir->field_0).op1;
      uVar8 = (ulong)*pIVar3;
      ir = pIVar2 + uVar8;
    } while ((short)*pIVar3 < 0);
  }
  lj_ir_kvalue(J->L,o,ir);
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    lj_ir_kvalue(J->L, o, ir);
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
    } else {
      lua_assert(!irt_ispri(t));  /* PRI refs never have a spill slot. */
      setgcrefi(o->gcr, *sps);
      setitype(o, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lua_assert(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
    } else {
      if (!irt_ispri(t))
	setgcrefi(o->gcr, ex->gpr[r-RID_MIN_GPR]);
      setitype(o, irt_toitype(t));
    }
  }
}